

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_Oneof_Test::TestBody
          (ParseMessageTest_Oneof_Test *this)

{
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,
             "message TestMessage {\n  oneof foo {\n    int32 a = 1;\n    string b = 2;\n    TestMessage c = 3;\n    group D = 4 { optional int32 i = 5; }\n  }\n}\n"
             ,
             "message_type {  name: \"TestMessage\"  field { name:\"a\" label:LABEL_OPTIONAL type:TYPE_INT32 number:1           oneof_index:0 }  field { name:\"b\" label:LABEL_OPTIONAL type:TYPE_STRING number:2           oneof_index:0 }  field { name:\"c\" label:LABEL_OPTIONAL type_name:\"TestMessage\"           number:3 oneof_index:0 }  field { name:\"d\" label:LABEL_OPTIONAL type:TYPE_GROUP           type_name:\"D\" number:4 oneof_index:0 }  oneof_decl {    name: \"foo\"  }  nested_type {    name: \"D\"    field { name:\"i\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5 }  }}"
            );
  return;
}

Assistant:

TEST_F(ParseMessageTest, Oneof) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  oneof foo {\n"
      "    int32 a = 1;\n"
      "    string b = 2;\n"
      "    TestMessage c = 3;\n"
      "    group D = 4 { optional int32 i = 5; }\n"
      "  }\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  field { name:\"a\" label:LABEL_OPTIONAL type:TYPE_INT32 number:1 "
      "          oneof_index:0 }"
      "  field { name:\"b\" label:LABEL_OPTIONAL type:TYPE_STRING number:2 "
      "          oneof_index:0 }"
      "  field { name:\"c\" label:LABEL_OPTIONAL type_name:\"TestMessage\" "
      "          number:3 oneof_index:0 }"
      "  field { name:\"d\" label:LABEL_OPTIONAL type:TYPE_GROUP "
      "          type_name:\"D\" number:4 oneof_index:0 }"
      "  oneof_decl {"
      "    name: \"foo\""
      "  }"
      "  nested_type {"
      "    name: \"D\""
      "    field { name:\"i\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5 }"
      "  }"
      "}");
}